

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

UniquePtr<GENERAL_NAME> __thiscall
anon_unknown.dwarf_862632::MakeGeneralName(anon_unknown_dwarf_862632 *this,int type,string *value)

{
  UniquePtr<ASN1_IA5STRING> UVar1;
  int iVar2;
  tuple<asn1_string_st_*,_bssl::internal::Deleter> str_00;
  UniquePtr<GENERAL_NAME> name;
  UniquePtr<ASN1_IA5STRING> str;
  
  if (((uint)type < 7) && ((0x46U >> (type & 0x1fU) & 1) != 0)) {
    str_00.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>)ASN1_IA5STRING_new();
    str._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         str_00.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl;
    name._M_t.super___uniq_ptr_impl<GENERAL_NAME_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_GENERAL_NAME_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_GENERAL_NAME_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)GENERAL_NAME_new();
    if (((tuple<GENERAL_NAME_st_*,_bssl::internal::Deleter>)
         name._M_t.super___uniq_ptr_impl<GENERAL_NAME_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_GENERAL_NAME_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_GENERAL_NAME_st_*,_false>._M_head_impl ==
         (_Head_base<0UL,_GENERAL_NAME_st_*,_false>)0x0 ||
         str_00.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
         (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) ||
       (iVar2 = ASN1_STRING_set((ASN1_STRING *)
                                str_00.
                                super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,
                                (value->_M_dataplus)._M_p,(int)value->_M_string_length), UVar1 = str
       , iVar2 == 0)) {
      *(undefined8 *)this = 0;
    }
    else {
      *(int *)name._M_t.super___uniq_ptr_impl<GENERAL_NAME_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_GENERAL_NAME_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_GENERAL_NAME_st_*,_false>._M_head_impl = type;
      str._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)0x0;
      ((__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true> *)
      ((long)name._M_t.super___uniq_ptr_impl<GENERAL_NAME_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_GENERAL_NAME_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_GENERAL_NAME_st_*,_false>._M_head_impl + 8))->
      super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter> =
           (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)
           UVar1._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl;
      *(__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true> *)this =
           name._M_t.super___uniq_ptr_impl<GENERAL_NAME_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_GENERAL_NAME_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_GENERAL_NAME_st_*,_false>._M_head_impl;
      name._M_t.super___uniq_ptr_impl<GENERAL_NAME_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_GENERAL_NAME_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_GENERAL_NAME_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<GENERAL_NAME_st,_bssl::internal::Deleter>)0x0;
    }
    std::unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter>::~unique_ptr(&name);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&str);
    return (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)this;
  }
  *(undefined8 *)this = 0;
  return (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<GENERAL_NAME> MakeGeneralName(int type,
                                                     const std::string &value) {
  if (type != GEN_EMAIL && type != GEN_DNS && type != GEN_URI) {
    // This function only supports the IA5String types.
    return nullptr;
  }
  bssl::UniquePtr<ASN1_IA5STRING> str(ASN1_IA5STRING_new());
  bssl::UniquePtr<GENERAL_NAME> name(GENERAL_NAME_new());
  if (!str || !name ||
      !ASN1_STRING_set(str.get(), value.data(), value.size())) {
    return nullptr;
  }

  name->type = type;
  name->d.ia5 = str.release();
  return name;
}